

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O1

uc_err reg_write_mips64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  ulong uVar1;
  uc_err uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (regid - 2 < 0x20) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(regid - 2) * 8) = *value;
  }
  else {
    uVar2 = UC_ERR_ARG;
    switch(regid) {
    case 0x81:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x108) = *value;
      break;
    case 0x82:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x128) = *value;
      break;
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
      goto switchD_004b28a7_caseD_83;
    case 0x89:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined4 *)((long)_env + 0x6d4) = *value;
      break;
    case 0x8a:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x1a0) = *value;
      break;
    case 0x8b:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      uVar3 = *value;
      *(uint *)((long)_env + 0x68c) = uVar3;
      *(uint *)((long)_env + 0x3e44) =
           (uVar3 & 4) << 0x1a | *(uint *)((long)_env + 0x3e44) & 0xc8a7fd04;
      if (((uVar3 & 6) == 0) && ((*(uint *)((long)_env + 0x3e44) & 4) == 0)) {
        *(uint *)((long)_env + 0x3e44) = *(uint *)((long)_env + 0x3e44) | uVar3 >> 3 & 3;
      }
      uVar1 = *(ulong *)((long)_env + 0x3e68);
      uVar4 = *(uint *)((long)_env + 0x3e44);
      if ((uVar1 & 4) == 0) {
LAB_004b2991:
        *(uint *)((long)_env + 0x3e44) = uVar4 | 0x200;
      }
      else {
        if ((uVar3 & 0x800020) != 0 || (uVar4 & 3) != 2) {
          *(uint *)((long)_env + 0x3e44) = uVar4 | 8;
        }
        uVar4 = *(uint *)((long)_env + 0x3e44);
        uVar5 = uVar4 & 3;
        if (((uVar3 & 0x20) == 0 && uVar5 == 2) ||
           ((((uint)uVar1 >> 0xe & 1) != 0 &&
            (((uVar3 & 0x40) == 0 && uVar5 == 1 || (uVar5 == 0 && (uVar3 & 0x80) == 0))))))
        goto LAB_004b2991;
      }
      if ((((byte)(uVar3 >> 0x1c) & ((uint)uVar1 >> 0xd & 1) == 0) != 0) ||
         ((*(byte *)((long)_env + 0x3e44) & 3) == 0)) {
        *(byte *)((long)_env + 0x3e44) = *(byte *)((long)_env + 0x3e44) | 0x10;
      }
      if ((uVar3 >> 0x1d & 1) != 0) {
        *(byte *)((long)_env + 0x3e44) = *(byte *)((long)_env + 0x3e44) | 0x20;
      }
      if ((uVar3 >> 0x1a & 1) != 0) {
        *(byte *)((long)_env + 0x3e44) = *(byte *)((long)_env + 0x3e44) | 0x40;
      }
      if (((*(uint *)((long)_env + 0x3e44) & 3) != 0) &&
         ((*(byte *)((long)_env + 0x6e0) & 0x40) != 0)) {
        *(uint *)((long)_env + 0x3e44) = *(uint *)((long)_env + 0x3e44) | 0x400000;
      }
      if ((uVar1 >> 0x25 & 1) == 0) {
        if ((uVar1 >> 0x24 & 1) != 0) {
          uVar4 = 0x180000;
          goto LAB_004b2adb;
        }
        uVar4 = 0x80000;
        if ((uVar3 >> 0x18 & 1) != 0 && (uVar1 >> 0x23 & 1) != 0) goto LAB_004b2ae1;
      }
      else {
        uVar4 = 0x20180000;
LAB_004b2adb:
        if ((uVar3 >> 0x18 & 1) != 0) {
LAB_004b2ae1:
          *(uint *)((long)_env + 0x3e44) = *(uint *)((long)_env + 0x3e44) | uVar4;
        }
      }
      if ((uVar1 & 0x40) == 0) {
        if ((uVar1 & 0x20) == 0) {
          if (-1 < (int)uVar3 || (uVar1 & 8) == 0) goto LAB_004b2b28;
          goto LAB_004b2b0b;
        }
        uVar3 = *(uint *)((long)_env + 0x3e44);
        if ((uVar3 & 8) == 0) goto LAB_004b2b28;
      }
      else {
        if ((*(byte *)((long)_env + 0x542) & 0x40) == 0) goto LAB_004b2b28;
LAB_004b2b0b:
        uVar3 = *(uint *)((long)_env + 0x3e44);
      }
      *(uint *)((long)_env + 0x3e44) = uVar3 | 0x80;
LAB_004b2b28:
      if (((uVar1 >> 0x29 & 1) != 0) && ((*(byte *)((long)_env + 0x6e3) & 8) != 0)) {
        *(byte *)((long)_env + 0x3e47) = *(byte *)((long)_env + 0x3e47) | 1;
      }
      if (((*(byte *)((long)_env + 0x543) & 0x20) != 0) &&
         ((*(byte *)((long)_env + 0x6e1) & 1) != 0)) {
        *(byte *)((long)_env + 0x3e47) = *(byte *)((long)_env + 0x3e47) | 2;
      }
      if ((*(byte *)((long)_env + 0x6d4) & 0x80) == 0) {
        return UC_ERR_OK;
      }
      if ((*(byte *)((long)_env + 0x5df) & 0x20) == 0) {
        return UC_ERR_OK;
      }
      *(byte *)((long)_env + 0x3e47) = *(byte *)((long)_env + 0x3e47) | 4;
      return UC_ERR_OK;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x100) = *value;
      *setpc = 1;
    }
  }
  uVar2 = UC_ERR_OK;
switchD_004b28a7_caseD_83:
  return uVar2;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        env->active_tc.gpr[regid - UC_MIPS_REG_0] = *(mipsreg_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.HI[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.LO[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.PC = *(mipsreg_t *)value;
            *setpc = 1;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Config3 = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            // TODO: ALL CP0 REGS
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00090-2B-MIPS32PRA-AFP-06.02.pdf
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00582-2B-microMIPS32-AFP-05.04.pdf
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Status = *(mipsreg_t *)value;
            compute_hflags(env);
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.CP0_UserLocal = *(mipsreg_t *)value;
            break;
        }
    }

    return ret;
}